

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void RunLegalizeBitcasts(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  VmInstruction *pVVar1;
  SynBase *source;
  VmFunction *pVVar2;
  VmBlock *pVVar3;
  VmValue **ppVVar4;
  TypeBase *type_00;
  VmConstant *address_00;
  TypeBase *type_01;
  VmValue *replacement;
  VmValue *loadInst;
  VmConstant *address;
  TypeBase *type;
  VmInstruction *next;
  VmInstruction *curr_1;
  VmBlock *block;
  VmBlock *curr;
  VmFunction *function;
  VmValue *value_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar2 = getType<VmFunction>(value);
  if (pVVar2 == (VmFunction *)0x0) {
    pVVar3 = getType<VmBlock>(value);
    if (pVVar3 != (VmBlock *)0x0) {
      module->currentBlock = pVVar3;
      pVVar1 = pVVar3->firstInstruction;
      while (next = pVVar1, next != (VmInstruction *)0x0) {
        pVVar1 = next->nextSibling;
        if (((next->cmd == VM_INST_BITCAST) &&
            (ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&next->arguments,0),
            ((*ppVVar4)->type).type == VM_TYPE_STRUCT)) &&
           ((next->super_VmValue).type.type == VM_TYPE_DOUBLE)) {
          type_00 = GetBaseType(ctx,(next->super_VmValue).type);
          address_00 = anon_unknown.dwarf_c91b1::CreateAlloca
                                 (ctx,module,(next->super_VmValue).source,type_00,"reg",true);
          pVVar3->insertPoint = next;
          source = (next->super_VmValue).source;
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&next->arguments,0);
          type_01 = GetBaseType(ctx,(*ppVVar4)->type);
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&next->arguments,0);
          anon_unknown.dwarf_c91b1::CreateStore
                    (ctx,module,source,type_01,&address_00->super_VmValue,*ppVVar4,0);
          replacement = anon_unknown.dwarf_c91b1::CreateLoad
                                  (ctx,module,(next->super_VmValue).source,type_00,
                                   &address_00->super_VmValue,0);
          pVVar3->insertPoint = pVVar3->lastInstruction;
          anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                    (module,&next->super_VmValue,replacement,(uint *)0x0);
        }
      }
    }
  }
  else {
    module->currentFunction = pVVar2;
    for (block = pVVar2->firstBlock; block != (VmBlock *)0x0; block = block->nextSibling) {
      RunLegalizeBitcasts(ctx,module,&block->super_VmValue);
    }
    module->currentFunction = (VmFunction *)0x0;
  }
  return;
}

Assistant:

void RunLegalizeBitcasts(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		module->currentFunction = function;

		for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
			RunLegalizeBitcasts(ctx, module, curr);

		module->currentFunction = NULL;
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		module->currentBlock = block;

		for(VmInstruction *curr = block->firstInstruction; curr;)
		{
			VmInstruction *next = curr->nextSibling;

			if(curr->cmd == VM_INST_BITCAST)
			{
				if(curr->arguments[0]->type.type == VM_TYPE_STRUCT && curr->type.type == VM_TYPE_DOUBLE)
				{
					TypeBase *type = GetBaseType(ctx, curr->type);

					VmConstant *address = CreateAlloca(ctx, module, curr->source, type, "reg", true);

					block->insertPoint = curr;

					CreateStore(ctx, module, curr->source, GetBaseType(ctx, curr->arguments[0]->type), address, curr->arguments[0], 0);
					VmValue *loadInst = CreateLoad(ctx, module, curr->source, type, address, 0);

					block->insertPoint = block->lastInstruction;

					ReplaceValueUsersWith(module, curr, loadInst, NULL);
				}
			}

			curr = next;
		}
	}
}